

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplaceRealloc<slang::ast::GenerateBlockSymbol_const&,int&>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,pointer pos,
          GenerateBlockSymbol *args,int *args_1)

{
  Element *this_00;
  ulong uVar1;
  pointer p;
  Symbol *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar1 = this->cap;
  if (uVar10 < uVar1 * 2) {
    uVar10 = uVar1 * 2;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    uVar10 = 0x3ffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pEVar5 = (pointer)operator_new(uVar10 << 5);
  this_00 = (Element *)((long)pEVar5 + lVar11);
  ast::HierarchicalReference::Element::Element(this_00,&args->super_Symbol,*args_1);
  p = this->data_;
  sVar9 = this->len;
  lVar8 = (long)p + (sVar9 * 0x20 - (long)pos);
  pEVar6 = p;
  pEVar7 = pEVar5;
  if (lVar8 == 0) {
    pEVar6 = pEVar5;
    pEVar7 = p;
    if (sVar9 != 0) {
      do {
        pSVar2 = (pEVar7->symbol).ptr;
        uVar3 = *(undefined8 *)
                 &(pEVar7->selector).
                  super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                  .super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                  .super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                  super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                  super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                  ._M_u;
        uVar4 = *(undefined8 *)
                 ((long)&(pEVar7->selector).
                         super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         .
                         super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                 + 0x10);
        *(undefined8 *)
         ((long)&(pEVar6->selector).
                 super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> + 8
         ) = *(undefined8 *)
              ((long)&(pEVar7->selector).
                      super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
              + 8);
        *(undefined8 *)
         ((long)&(pEVar6->selector).
                 super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                 super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> +
         0x10) = uVar4;
        (pEVar6->symbol).ptr = pSVar2;
        *(undefined8 *)
         &(pEVar6->selector).
          super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
          super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
          super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
          super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
          super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> =
             uVar3;
        pEVar7 = pEVar7 + 1;
        pEVar6 = pEVar6 + 1;
      } while (pEVar7 != pos);
    }
  }
  else {
    for (; pEVar6 != pos; pEVar6 = pEVar6 + 1) {
      pSVar2 = (pEVar6->symbol).ptr;
      uVar3 = *(undefined8 *)
               &(pEVar6->selector).
                super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                ._M_u;
      uVar4 = *(undefined8 *)
               ((long)&(pEVar6->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + 0x10);
      *(undefined8 *)
       ((long)&(pEVar7->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> + 8)
           = *(undefined8 *)
              ((long)&(pEVar6->selector).
                      super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
              + 8);
      *(undefined8 *)
       ((long)&(pEVar7->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> +
       0x10) = uVar4;
      (pEVar7->symbol).ptr = pSVar2;
      *(undefined8 *)
       &(pEVar7->selector).
        super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> =
           uVar3;
      pEVar7 = pEVar7 + 1;
    }
    memcpy((void *)((long)pEVar5 + lVar11 + 0x20),pos,(lVar8 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar9 = this->len;
  }
  this->len = sVar9 + 1;
  this->cap = uVar10;
  this->data_ = pEVar5;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}